

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_buildmap.cpp
# Opt level: O0

void LoadWalls(walltype *walls,int numwalls,sectortype *bsec)

{
  char *buffer;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  side_t *psVar8;
  vertex_t *pvVar9;
  line_t *plVar10;
  double dVar11;
  side_t *local_1d0;
  side_t *local_1c8;
  line_t *local_1b0;
  vertex_t *local_140;
  side_t *local_110;
  intptr_t back;
  intptr_t front;
  int sidenum;
  int linenum;
  SlopeWork slope;
  FTextureID local_48;
  FTextureID local_44;
  FTextureID pic;
  FTextureID overpic;
  char tnam [9];
  int local_28;
  DWORD local_24;
  int j;
  int i;
  sectortype *bsec_local;
  int numwalls_local;
  walltype *walls_local;
  
  numlines = 0;
  uVar6 = (ulong)numwalls;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar6;
  uVar7 = SUB168(auVar1 * ZEXT816(0xd8),0);
  if (SUB168(auVar1 * ZEXT816(0xd8),8) != 0) {
    uVar7 = 0xffffffffffffffff;
  }
  numvertexes = numwalls;
  numsides = numwalls;
  psVar8 = (side_t *)operator_new__(uVar7);
  if (uVar6 != 0) {
    local_110 = psVar8;
    do {
      side_t::side_t(local_110);
      local_110 = local_110 + 1;
    } while (local_110 != psVar8 + uVar6);
  }
  sides = psVar8;
  memset(psVar8,0,(long)numsides * 0xd8);
  uVar6 = (ulong)numvertexes;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar6;
  uVar7 = SUB168(auVar2 * ZEXT816(0x38),0);
  if (SUB168(auVar2 * ZEXT816(0x38),8) != 0) {
    uVar7 = 0xffffffffffffffff;
  }
  pvVar9 = (vertex_t *)operator_new__(uVar7);
  if (uVar6 != 0) {
    local_140 = pvVar9;
    do {
      vertex_t::vertex_t(local_140);
      local_140 = local_140 + 1;
    } while (local_140 != pvVar9 + uVar6);
  }
  numvertexes = 0;
  vertexes = pvVar9;
  for (local_24 = 0; (int)local_24 < numsectors; local_24 = local_24 + 1) {
    if (-1 < bsec[(int)local_24].wallptr) {
      for (local_28 = 0; local_28 < bsec[(int)local_24].wallnum; local_28 = local_28 + 1) {
        sides[local_28 + bsec[(int)local_24].wallptr].sector = sectors + (int)local_24;
      }
    }
  }
  for (local_24 = 0; (int)local_24 < numwalls; local_24 = local_24 + 1) {
    FTextureID::FTextureID(&local_44);
    FTextureID::FTextureID(&local_48);
    buffer = (char *)((long)&pic.texnum + 3);
    mysnprintf(buffer,9,"BTIL%04d",(ulong)(uint)(int)walls[(int)local_24].picnum);
    local_48 = FTextureManager::GetTexture(&TexMan,buffer,5,0);
    mysnprintf(buffer,9,"BTIL%04d",(ulong)(uint)(int)walls[(int)local_24].overpicnum);
    local_44 = FTextureManager::GetTexture(&TexMan,buffer,5,0);
    side_t::SetTextureXOffset(sides + (int)local_24,(double)walls[(int)local_24].xpanning);
    side_t::SetTextureYOffset(sides + (int)local_24,(double)walls[(int)local_24].ypanning);
    side_t::SetTexture(sides + (int)local_24,0,local_48);
    side_t::SetTexture(sides + (int)local_24,2,local_48);
    if ((walls[(int)local_24].nextsector < 0) || ((walls[(int)local_24].cstat & 0x20U) != 0)) {
      side_t::SetTexture(sides + (int)local_24,1,local_48);
    }
    else if ((walls[(int)local_24].cstat & 0x10U) == 0) {
      psVar8 = sides + (int)local_24;
      FNullTextureID::FNullTextureID((FNullTextureID *)&slope.heinum);
      slope.heinum._4_4_ = slope.heinum._0_4_;
      side_t::SetTexture(psVar8,1,slope.heinum._0_4_);
    }
    else {
      side_t::SetTexture(sides + (int)local_24,1,local_44);
    }
    sides[(int)local_24].TexelLength = (ushort)walls[(int)local_24].xrepeat << 3;
    side_t::SetTextureYScale(sides + (int)local_24,(double)walls[(int)local_24].yrepeat / 8.0);
    side_t::SetTextureXScale(sides + (int)local_24,1.0);
    side_t::SetLight(sides + (int)local_24,walls[(int)local_24].shade * -2 + 0xff);
    sides[(int)local_24].Flags = '\x01';
    sides[(int)local_24].RightSide = (int)walls[(int)local_24].point2;
    sides[walls[(int)local_24].point2].LeftSide = local_24;
    if ((walls[(int)local_24].nextwall < 0) || ((int)local_24 < (int)walls[(int)local_24].nextwall))
    {
      plVar10 = (line_t *)(long)numlines;
      numlines = numlines + 1;
      sides[(int)local_24].linedef = plVar10;
    }
    else {
      sides[(int)local_24].linedef = sides[walls[(int)local_24].nextwall].linedef;
    }
  }
  uVar6 = (ulong)numlines;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar6;
  uVar7 = SUB168(auVar3 * ZEXT816(0x98),0);
  if (SUB168(auVar3 * ZEXT816(0x98),8) != 0) {
    uVar7 = 0xffffffffffffffff;
  }
  plVar10 = (line_t *)operator_new__(uVar7);
  if (uVar6 != 0) {
    local_1b0 = plVar10;
    do {
      line_t::line_t(local_1b0);
      local_1b0 = local_1b0 + 1;
    } while (local_1b0 != plVar10 + uVar6);
  }
  lines = plVar10;
  memset(plVar10,0,(long)numlines * 0x98);
  for (local_24 = 0; (int)local_24 < numwalls; local_24 = local_24 + 1) {
    if ((walls[(int)local_24].nextwall < 0) || ((int)local_24 < (int)walls[(int)local_24].nextwall))
    {
      iVar4 = (int)sides[(int)local_24].linedef;
      lines[iVar4].sidedef[0] = (side_t *)(long)(int)local_24;
      lines[iVar4].sidedef[1] = (side_t *)(long)walls[(int)local_24].nextwall;
      pvVar9 = FindVertex(walls[(int)local_24].x,walls[(int)local_24].y);
      lines[iVar4].v1 = pvVar9;
      pvVar9 = FindVertex(walls[walls[(int)local_24].point2].x,walls[walls[(int)local_24].point2].y)
      ;
      lines[iVar4].v2 = pvVar9;
      lines[iVar4].frontsector = sides[(int)local_24].sector;
      lines[iVar4].flags = lines[iVar4].flags | 0x100000;
      if (walls[(int)local_24].nextsector < 0) {
        lines[iVar4].backsector = (sector_t *)0x0;
      }
      else {
        lines[iVar4].backsector = sectors + (int)walls[(int)local_24].nextsector;
        lines[iVar4].flags = lines[iVar4].flags | 4;
      }
      P_AdjustLine(lines + iVar4);
      if ((walls[(int)local_24].cstat & 0x80U) != 0) {
        if ((walls[(int)local_24].cstat & 0x200U) == 0) {
          lines[iVar4].alpha = 0.6666666666666666;
        }
        else {
          lines[iVar4].alpha = 0.3333333333333333;
        }
      }
      if ((walls[(int)local_24].cstat & 1U) != 0) {
        lines[iVar4].flags = lines[iVar4].flags | 1;
      }
      if (walls[(int)local_24].nextwall < 0) {
        if ((walls[(int)local_24].cstat & 4U) != 0) {
          lines[iVar4].flags = lines[iVar4].flags | 0x10;
        }
      }
      else if ((walls[(int)local_24].cstat & 4U) == 0) {
        lines[iVar4].flags = lines[iVar4].flags | 0x10;
      }
      else {
        lines[iVar4].flags = lines[iVar4].flags | 8;
      }
      if ((walls[(int)local_24].cstat & 0x40U) != 0) {
        lines[iVar4].flags = lines[iVar4].flags | 0x8000;
      }
    }
  }
  _j = bsec;
  for (local_24 = 0; (int)local_24 < numsectors; local_24 = local_24 + 1) {
    _sidenum = walls + _j->wallptr;
    slope.wal = walls + _sidenum->point2;
    slope.wal2 = (walltype *)(long)((slope.wal)->x - _sidenum->x);
    slope.dx = (long)((slope.wal)->y - _sidenum->y);
    dVar11 = c_sqrt((double)((long)slope.wal2 * (long)slope.wal2 + slope.dx * slope.dx));
    slope.dy = (long)dVar11 << 5;
    if (slope.dy != 0) {
      if (((_j->floorstat & 2U) != 0) && (_j->floorheinum != 0)) {
        slope.z[2] = (long)-(int)_j->floorheinum;
        slope.y[2] = (long)-_j->floorZ;
        slope.z[0] = slope.y[2];
        slope.z[1] = slope.y[2];
        CalcPlane((SlopeWork *)&sidenum,&sectors[(int)local_24].floorplane);
      }
      if (((_j->ceilingstat & 2U) != 0) && (_j->ceilingheinum != 0)) {
        slope.z[2] = (long)-(int)_j->ceilingheinum;
        slope.y[2] = (long)-_j->ceilingZ;
        slope.z[0] = slope.y[2];
        slope.z[1] = slope.y[2];
        CalcPlane((SlopeWork *)&sidenum,&sectors[(int)local_24].ceilingplane);
      }
      iVar4 = (int)sides[_j->wallptr].linedef;
      iVar5 = (int)lines[iVar4].sidedef[1];
      if ((_j->floorstat & 0x40U) != 0) {
        P_AlignFlat(iVar4,(uint)(iVar5 == _j->wallptr),0);
      }
      if ((_j->ceilingstat & 0x40U) != 0) {
        P_AlignFlat(iVar4,(uint)(iVar5 == _j->wallptr),0);
      }
    }
    _j = _j + 1;
  }
  for (local_24 = 0; (int)local_24 < numlines; local_24 = local_24 + 1) {
    local_1d0 = lines[(int)local_24].sidedef[1];
    if ((long)lines[(int)local_24].sidedef[0] < 0) {
      local_1c8 = (side_t *)0x0;
    }
    else {
      local_1c8 = sides + (long)lines[(int)local_24].sidedef[0];
    }
    lines[(int)local_24].sidedef[0] = local_1c8;
    if ((long)local_1d0 < 0) {
      local_1d0 = (side_t *)0x0;
    }
    else {
      local_1d0 = sides + (long)local_1d0;
    }
    lines[(int)local_24].sidedef[1] = local_1d0;
  }
  local_24 = 0;
  while( true ) {
    if (numsides <= (int)local_24) {
      return;
    }
    if (sides[(int)local_24].sector == (sector_t *)0x0) break;
    sides[(int)local_24].linedef = lines + (long)sides[(int)local_24].linedef;
    local_24 = local_24 + 1;
  }
  __assert_fail("sides[i].sector != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_buildmap.cpp"
                ,0x2a5,"void LoadWalls(walltype *, int, sectortype *)");
}

Assistant:

static void LoadWalls (walltype *walls, int numwalls, sectortype *bsec)
{
	int i, j;

	// Setting numvertexes to the same as numwalls is overly conservative,
	// but the extra vertices will be removed during the BSP building pass.
	numsides = numvertexes = numwalls;
	numlines = 0;

	sides = new side_t[numsides];
	memset (sides, 0, numsides*sizeof(side_t));

	vertexes = new vertex_t[numvertexes];
	numvertexes = 0;

	// First mark each sidedef with the sector it belongs to
	for (i = 0; i < numsectors; ++i)
	{
		if (bsec[i].wallptr >= 0)
		{
			for (j = 0; j < bsec[i].wallnum; ++j)
			{
				sides[j + bsec[i].wallptr].sector = sectors + i;
			}
		}
	}

	// Now copy wall properties to their matching sidedefs
	for (i = 0; i < numwalls; ++i)
	{
		char tnam[9];
		FTextureID overpic, pic;

		mysnprintf (tnam, countof(tnam), "BTIL%04d", LittleShort(walls[i].picnum));
		pic = TexMan.GetTexture (tnam, FTexture::TEX_Build);
		mysnprintf (tnam, countof(tnam), "BTIL%04d", LittleShort(walls[i].overpicnum));
		overpic = TexMan.GetTexture (tnam, FTexture::TEX_Build);

		walls[i].x = LittleLong(walls[i].x);
		walls[i].y = LittleLong(walls[i].y);
		walls[i].point2 = LittleShort(walls[i].point2);
		walls[i].cstat = LittleShort(walls[i].cstat);
		walls[i].nextwall = LittleShort(walls[i].nextwall);
		walls[i].nextsector = LittleShort(walls[i].nextsector);

		sides[i].SetTextureXOffset((double)walls[i].xpanning);
		sides[i].SetTextureYOffset((double)walls[i].ypanning);

		sides[i].SetTexture(side_t::top, pic);
		sides[i].SetTexture(side_t::bottom, pic);
		if (walls[i].nextsector < 0 || (walls[i].cstat & 32))
		{
			sides[i].SetTexture(side_t::mid, pic);
		}
		else if (walls[i].cstat & 16)
		{
			sides[i].SetTexture(side_t::mid, overpic);
		}
		else
		{
			sides[i].SetTexture(side_t::mid, FNullTextureID());
		}

		sides[i].TexelLength = walls[i].xrepeat * 8;
		sides[i].SetTextureYScale(walls[i].yrepeat / 8.);
		sides[i].SetTextureXScale(1.);
		sides[i].SetLight(SHADE2LIGHT(walls[i].shade));
		sides[i].Flags = WALLF_ABSLIGHTING;
		sides[i].RightSide = walls[i].point2;
		sides[walls[i].point2].LeftSide = i;

		if (walls[i].nextwall >= 0 && walls[i].nextwall <= i)
		{
			sides[i].linedef = sides[walls[i].nextwall].linedef;
		}
		else
		{
			sides[i].linedef = (line_t*)(intptr_t)(numlines++);
		}
	}

	// Set line properties that Doom doesn't store per-sidedef
	lines = new line_t[numlines];
	memset (lines, 0, numlines*sizeof(line_t));

	for (i = 0, j = -1; i < numwalls; ++i)
	{
		if (walls[i].nextwall >= 0 && walls[i].nextwall <= i)
		{
			continue;
		}

		j = int(intptr_t(sides[i].linedef));
		lines[j].sidedef[0] = (side_t*)(intptr_t)i;
		lines[j].sidedef[1] = (side_t*)(intptr_t)walls[i].nextwall;
		lines[j].v1 = FindVertex (walls[i].x, walls[i].y);
		lines[j].v2 = FindVertex (walls[walls[i].point2].x, walls[walls[i].point2].y);
		lines[j].frontsector = sides[i].sector;
		lines[j].flags |= ML_WRAP_MIDTEX;
		if (walls[i].nextsector >= 0)
		{
			lines[j].backsector = sectors + walls[i].nextsector;
			lines[j].flags |= ML_TWOSIDED;
		}
		else
		{
			lines[j].backsector = NULL;
		}
		P_AdjustLine (&lines[j]);
		if (walls[i].cstat & 128)
		{
			if (walls[i].cstat & 512)
			{
				lines[j].alpha = 1/3.;
			}
			else
			{
				lines[j].alpha = 2/3.;
			}
		}
		if (walls[i].cstat & 1)
		{
			lines[j].flags |= ML_BLOCKING;
		}
		if (walls[i].nextwall < 0)
		{
			if (walls[i].cstat & 4)
			{
				lines[j].flags |= ML_DONTPEGBOTTOM;
			}
		}
		else
		{
			if (walls[i].cstat & 4)
			{
				lines[j].flags |= ML_DONTPEGTOP;
			}
			else
			{
				lines[j].flags |= ML_DONTPEGBOTTOM;
			}
		}
		if (walls[i].cstat & 64)
		{
			lines[j].flags |= ML_BLOCKEVERYTHING;
		}
	}

	// Finish setting sector properties that depend on walls
	for (i = 0; i < numsectors; ++i, ++bsec)
	{
		SlopeWork slope;

		slope.wal = &walls[bsec->wallptr];
		slope.wal2 = &walls[slope.wal->point2];
		slope.dx = slope.wal2->x - slope.wal->x;
		slope.dy = slope.wal2->y - slope.wal->y;
		slope.i = long (g_sqrt ((double)(slope.dx*slope.dx+slope.dy*slope.dy))) << 5;
		if (slope.i == 0)
		{
			continue;
		}
		if ((bsec->floorstat & 2) && (bsec->floorheinum != 0))
		{ // floor is sloped
			slope.heinum = -LittleShort(bsec->floorheinum);
			slope.z[0] = slope.z[1] = slope.z[2] = -bsec->floorZ;
			CalcPlane (slope, sectors[i].floorplane);
		}
		if ((bsec->ceilingstat & 2) && (bsec->ceilingheinum != 0))
		{ // ceiling is sloped
			slope.heinum = -LittleShort(bsec->ceilingheinum);
			slope.z[0] = slope.z[1] = slope.z[2] = -bsec->ceilingZ;
			CalcPlane (slope, sectors[i].ceilingplane);
		}
		int linenum = int(intptr_t(sides[bsec->wallptr].linedef));
		int sidenum = int(intptr_t(lines[linenum].sidedef[1]));
		if (bsec->floorstat & 64)
		{ // floor is aligned to first wall
			P_AlignFlat (linenum, sidenum == bsec->wallptr, 0);
		}
		if (bsec->ceilingstat & 64)
		{ // ceiling is aligned to first wall
			P_AlignFlat (linenum, sidenum == bsec->wallptr, 0);
		}
	}
	for (i = 0; i < numlines; i++)
	{
		intptr_t front = intptr_t(lines[i].sidedef[0]);
		intptr_t back = intptr_t(lines[i].sidedef[1]);
		lines[i].sidedef[0] = front >= 0 ? &sides[front] : NULL;
		lines[i].sidedef[1] = back >= 0 ? &sides[back] : NULL;
	}
	for (i = 0; i < numsides; i++)
	{
		assert(sides[i].sector != NULL);
		sides[i].linedef = &lines[intptr_t(sides[i].linedef)];
	}
}